

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonStartElement(void *user_data,xmlChar *name,xmlChar **attrs)

{
  int iVar1;
  int iVar2;
  PyObject *op;
  PyObject *pPVar3;
  long lVar4;
  char *pcVar5;
  xmlChar **ppxVar6;
  PyObject *op_00;
  
  iVar1 = PyObject_HasAttrString(user_data,"startElement");
  if (iVar1 == 0) {
    iVar2 = PyObject_HasAttrString(user_data,"start");
    if (iVar2 == 0) {
      return;
    }
    if (attrs != (xmlChar **)0x0) goto LAB_0013c273;
    op_00 = (PyObject *)PyDict_New();
LAB_0013c30d:
    pcVar5 = "start";
  }
  else {
    if (attrs == (xmlChar **)0x0) {
      op_00 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    else {
LAB_0013c273:
      op_00 = (PyObject *)PyDict_New();
      for (ppxVar6 = attrs + 1; ppxVar6[-1] != (xmlChar *)0x0; ppxVar6 = ppxVar6 + 2) {
        pPVar3 = (PyObject *)PyUnicode_FromString();
        if (*ppxVar6 == (xmlChar *)0x0) {
          __Py_NoneStruct = __Py_NoneStruct + 1;
          op = (PyObject *)&_Py_NoneStruct;
        }
        else {
          op = (PyObject *)PyUnicode_FromString();
        }
        PyDict_SetItem(op_00,pPVar3,op);
        _Py_DECREF(pPVar3);
        _Py_DECREF(op);
      }
      if (iVar1 == 0) goto LAB_0013c30d;
    }
    pcVar5 = "startElement";
  }
  pPVar3 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,pcVar5,"sO",name,op_00);
  lVar4 = PyErr_Occurred();
  if (lVar4 != 0) {
    PyErr_Print();
  }
  _Py_XDECREF(op_00);
  _Py_XDECREF(pPVar3);
  return;
}

Assistant:

static void
pythonStartElement(void *user_data, const xmlChar * name,
                   const xmlChar ** attrs)
{
    int i;
    PyObject *handler;
    PyObject *dict;
    PyObject *attrname;
    PyObject *attrvalue;
    PyObject *result = NULL;
    int type = 0;

#ifdef DEBUG_SAX
    printf("pythonStartElement(%s) called\n", name);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "startElement"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "start"))
        type = 2;
    if (type != 0) {
        /*
         * the xmllib interface always generates a dictionary,
         * possibly empty
         */
        if ((attrs == NULL) && (type == 1)) {
            Py_XINCREF(Py_None);
            dict = Py_None;
        } else if (attrs == NULL) {
            dict = PyDict_New();
        } else {
            dict = PyDict_New();
            for (i = 0; attrs[i] != NULL; i++) {
                attrname = PY_IMPORT_STRING((char *) attrs[i]);
                i++;
                if (attrs[i] != NULL) {
                    attrvalue = PY_IMPORT_STRING((char *) attrs[i]);
                } else {
                    Py_XINCREF(Py_None);
                    attrvalue = Py_None;
                }
                PyDict_SetItem(dict, attrname, attrvalue);
		Py_DECREF(attrname);
		Py_DECREF(attrvalue);
            }
        }

        if (type == 1)
            result = PyObject_CallMethod(handler, (char *) "startElement",
                                         (char *) "sO", name, dict);
        else if (type == 2)
            result = PyObject_CallMethod(handler, (char *) "start",
                                         (char *) "sO", name, dict);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(dict);
        Py_XDECREF(result);
    }
}